

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcObj.c
# Opt level: O0

Abc_Obj_t * Abc_NtkDupBox(Abc_Ntk_t *pNtkNew,Abc_Obj_t *pBox,int fCopyName)

{
  int iVar1;
  Abc_Obj_t *pObj;
  Abc_Obj_t *pAVar2;
  int local_34;
  int i;
  Abc_Obj_t *pBoxNew;
  Abc_Obj_t *pTerm;
  int fCopyName_local;
  Abc_Obj_t *pBox_local;
  Abc_Ntk_t *pNtkNew_local;
  
  iVar1 = Abc_ObjIsBox(pBox);
  if (iVar1 == 0) {
    __assert_fail("Abc_ObjIsBox(pBox)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcObj.c"
                  ,0x1a2,"Abc_Obj_t *Abc_NtkDupBox(Abc_Ntk_t *, Abc_Obj_t *, int)");
  }
  pObj = Abc_NtkDupObj(pNtkNew,pBox,fCopyName);
  for (local_34 = 0; iVar1 = Abc_ObjFaninNum(pBox), local_34 < iVar1; local_34 = local_34 + 1) {
    pAVar2 = Abc_ObjFanin(pBox,local_34);
    pAVar2 = Abc_NtkDupObj(pNtkNew,pAVar2,fCopyName);
    Abc_ObjAddFanin(pObj,pAVar2);
  }
  for (local_34 = 0; iVar1 = Abc_ObjFanoutNum(pBox), local_34 < iVar1; local_34 = local_34 + 1) {
    pAVar2 = Abc_ObjFanout(pBox,local_34);
    pAVar2 = Abc_NtkDupObj(pNtkNew,pAVar2,fCopyName);
    Abc_ObjAddFanin(pAVar2,pObj);
  }
  return pObj;
}

Assistant:

Abc_Obj_t * Abc_NtkDupBox( Abc_Ntk_t * pNtkNew, Abc_Obj_t * pBox, int fCopyName )
{
    Abc_Obj_t * pTerm, * pBoxNew;
    int i;
    assert( Abc_ObjIsBox(pBox) );
    // duplicate the box 
    pBoxNew = Abc_NtkDupObj( pNtkNew, pBox, fCopyName );
    // duplicate the fanins and connect them
    Abc_ObjForEachFanin( pBox, pTerm, i )
        Abc_ObjAddFanin( pBoxNew, Abc_NtkDupObj(pNtkNew, pTerm, fCopyName) );
    // duplicate the fanouts and connect them
    Abc_ObjForEachFanout( pBox, pTerm, i )
        Abc_ObjAddFanin( Abc_NtkDupObj(pNtkNew, pTerm, fCopyName), pBoxNew );
    return pBoxNew;
}